

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall
Catch::TestRunStats::TestRunStats
          (TestRunStats *this,TestRunInfo *_runInfo,Totals *_totals,bool _aborting)

{
  pointer pcVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  int iVar6;
  undefined4 uVar7;
  
  this->_vptr_TestRunStats = (_func_int **)&PTR__TestRunStats_001e1050;
  (this->runInfo).name._M_dataplus._M_p = (pointer)&(this->runInfo).name.field_2;
  pcVar1 = (_runInfo->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->runInfo,pcVar1,pcVar1 + (_runInfo->name)._M_string_length);
  (this->totals).testCases.failedButOk = (_totals->testCases).failedButOk;
  iVar6 = _totals->error;
  uVar7 = *(undefined4 *)&_totals->field_0x4;
  sVar2 = (_totals->assertions).passed;
  sVar3 = (_totals->assertions).failed;
  sVar4 = (_totals->assertions).failedButOk;
  sVar5 = (_totals->testCases).failed;
  (this->totals).testCases.passed = (_totals->testCases).passed;
  (this->totals).testCases.failed = sVar5;
  (this->totals).assertions.failed = sVar3;
  (this->totals).assertions.failedButOk = sVar4;
  (this->totals).error = iVar6;
  *(undefined4 *)&(this->totals).field_0x4 = uVar7;
  (this->totals).assertions.passed = sVar2;
  this->aborting = _aborting;
  return;
}

Assistant:

TestRunStats::TestRunStats(   TestRunInfo const& _runInfo,
                    Totals const& _totals,
                    bool _aborting )
    :   runInfo( _runInfo ),
        totals( _totals ),
        aborting( _aborting )
    {}